

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall
SubcommandProgram_MultipleArgs_Test::TestBody(SubcommandProgram_MultipleArgs_Test *this)

{
  bool bVar1;
  char *message;
  long lVar2;
  AssertionResult gtest_ar;
  AssertHelper local_88;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  unsigned_long local_30;
  
  local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"start","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"stop","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_SubcommandProgram).super_TApp.args,&local_70,&local_30);
  lVar2 = 0;
  do {
    if (local_40 + lVar2 != *(undefined1 **)((long)local_50 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  TApp::run((TApp *)this);
  local_88.data_ = (AssertHelperData *)0x2;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            (&local_70,&(this->super_SubcommandProgram).super_TApp.app.parsed_subcommands_);
  local_30 = (long)local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_80,"(size_t)2","app.get_subcommands().size()",(unsigned_long *)&local_88,
             &local_30);
  if (local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1e5,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        (*(code *)*(pointer)((long)*local_70.
                                    super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_70.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(SubcommandProgram, MultipleArgs) {
    args = {"start", "stop"};

    run();

    EXPECT_EQ((size_t)2, app.get_subcommands().size());
}